

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heatbath.cpp
# Opt level: O3

int main(void)

{
  bool bVar1;
  size_t __i;
  ostream *poVar2;
  long lVar3;
  pointer pdVar4;
  ulong uVar5;
  value_type *__val;
  char *pcVar6;
  char *pcVar7;
  size_t j;
  long lVar8;
  size_t i;
  double dVar9;
  vector<double,_std::allocator<double>_> weights;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  transition_matrix;
  engine_type eng;
  char local_13e9;
  vector<double,_std::allocator<double>_> local_13e8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_13c8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b0;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"number of bins = ",0x11)
  ;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  local_13b0._M_x[0] = 0x72e3;
  lVar3 = 1;
  uVar5 = 0x72e3;
  do {
    uVar5 = (ulong)(((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar3);
    local_13b0._M_x[lVar3] = uVar5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x270);
  local_13b0._M_p = 0x270;
  local_13e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_13e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_13e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pdVar4 = (pointer)operator_new(0x40);
  local_13e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar4 + 8;
  pdVar4[6] = 0.0;
  pdVar4[7] = 0.0;
  pdVar4[4] = 0.0;
  pdVar4[5] = 0.0;
  pdVar4[2] = 0.0;
  pdVar4[3] = 0.0;
  *pdVar4 = 0.0;
  pdVar4[1] = 0.0;
  lVar3 = 0;
  local_13e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = pdVar4;
  local_13e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_13e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  do {
    dVar9 = std::
            generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                      (&local_13b0);
    *(double *)((long)pdVar4 + lVar3) = dVar9 + 0.0;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x40);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[weights]\n",10);
  lVar3 = 0;
  do {
    poVar2 = std::ostream::_M_insert<double>
                       (local_13e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar3]);
    local_13c8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_13c8.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_13c8,1);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  local_13c8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_13c8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13c8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bcl::heatbath::
  generate_transition_matrix_resize<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
            (&local_13e8,&local_13c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[transition matrix]\n",0x14);
  lVar3 = 0;
  do {
    lVar8 = 0;
    do {
      poVar2 = std::ostream::_M_insert<double>
                         (local_13c8.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar3].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar8]);
      local_13e9 = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_13e9,1);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[check transition matrix]\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"probability conservation = ",0x1b);
  bVar1 = bcl::
          check_probability_conservation<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
                    (&local_13c8,1e-10);
  pcVar6 = "fail";
  pcVar7 = "fail";
  if (bVar1) {
    pcVar7 = "pass";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"detailed balance condition = ",0x1d);
  bVar1 = bcl::
          check_detailed_balance<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
                    (&local_13e8,&local_13c8,1e-10);
  pcVar7 = "fail";
  if (bVar1) {
    pcVar7 = "pass";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"balance condition = ",0x14);
  bVar1 = bcl::
          check_balance_condition<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
                    (&local_13e8,&local_13c8,1e-10);
  if (bVar1) {
    pcVar6 = "pass";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"average rejection = ",0x14);
  if ((long)local_13e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_13e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    dVar9 = NAN;
  }
  else {
    lVar3 = (long)local_13e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_13e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    lVar3 = lVar3 + -1 + (ulong)(lVar3 == 0);
    dVar9 = (local_13c8.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar3].
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar3] *
            local_13e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar3]) /
            local_13e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar3];
  }
  poVar2 = std::ostream::_M_insert<double>(dVar9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_13c8);
  if (local_13e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_13e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_13e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_13e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
try {
  std::cout << "number of bins = " << n << std::endl;

  // random number generator
  typedef std::mt19937 engine_type;
  engine_type eng(29411);
  std::uniform_real_distribution<> dist;

  // generate weights
  std::vector<double> weights(n);
  for (auto& w : weights) w = dist(eng);
  std::cout << "[weights]\n";
  for (std::size_t i = 0; i < n; ++i) std::cout << weights[i] << ' ';
  std::cout << std::endl;

  // generate transtition matrix
  std::vector<std::vector<double> > transition_matrix;
  bcl::heatbath::generate_transition_matrix_resize(weights, transition_matrix);

  std::cout << "[transition matrix]\n";
  for (std::size_t i = 0; i < n; ++i) {
    for (std::size_t j = 0; j < n; ++j) {
      std::cout << transition_matrix[i][j] << ' ';
    }
    std::cout << std::endl;
  }

  // check transition matrix
  std::cout << "[check transition matrix]\n";
  std::cout << "probability conservation = "
            << (bcl::check_probability_conservation(transition_matrix) ? "pass" : "fail")
            << std::endl;
  std::cout << "detailed balance condition = "
            << (bcl::check_detailed_balance(weights, transition_matrix) ? "pass" : "fail")
            << std::endl;
  std::cout << "balance condition = "
            << (bcl::check_balance_condition(weights, transition_matrix) ? "pass" : "fail")
            << std::endl;

  std::cout << "average rejection = " << bcl::average_rejection(weights, transition_matrix) 
            << std::endl;
}
catch (const std::exception& excp) {
  std::cerr << excp.what() << std::endl;
  std::exit(-1); }
catch (...) {
  std::cerr << "Unknown exception occurred!" << std::endl;
  std::exit(-1); }
}